

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createLightSource_distant(SemanticParser *this,SP *in)

{
  long lVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  element_type *peVar5;
  element_type *peVar6;
  int iVar7;
  runtime_error *this_00;
  long *plVar8;
  long *plVar9;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  SP *result;
  ParamSet *this_01;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  undefined1 auVar13 [16];
  SP SVar14;
  SP light;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  SemanticParser *local_c8;
  string local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = (element_type *)0x0;
  local_c8 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::DistantLightSource,std::allocator<pbrt::DistantLightSource>>
            (&_Stack_d0,(DistantLightSource **)&local_d8,
             (allocator<pbrt::DistantLightSource> *)&local_80);
  std::__shared_ptr<pbrt::DistantLightSource,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::DistantLightSource,pbrt::DistantLightSource>
            ((__shared_ptr<pbrt::DistantLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             (DistantLightSource *)local_d8);
  lVar1 = *in_RDX;
  psVar2 = *(pointer *)(lVar1 + 0x58);
  psVar3 = *(pointer *)(lVar1 + 0x60);
  psVar4 = *(pointer *)(lVar1 + 0x68);
  peVar5 = *(element_type **)(lVar1 + 0x70);
  peVar6 = *(element_type **)(lVar1 + 0x80);
  (local_d8->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x78);
  (local_d8->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  (local_d8->cameras).
  super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar4;
  (local_d8->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (local_d8->cameras).
  super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar2;
  (local_d8->cameras).
  super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  p_Var12 = *(_Rb_tree_node_base **)(*in_RDX + 0x20);
  p_Var11 = (_Rb_tree_node_base *)(*in_RDX + 0x10);
  _Var10._M_pi = extraout_RDX;
  if (p_Var12 != p_Var11) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_80,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var12 + 1));
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_80.first._M_dataplus._M_p,
                 local_80.first._M_dataplus._M_p + local_80.first._M_string_length);
      iVar7 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar7 == 0) {
        this_01 = (ParamSet *)(*in_RDX + 8);
        result = (SP *)&(local_d8->sampler).
                        super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar7 == 0) {
          this_01 = (ParamSet *)(*in_RDX + 8);
          result = (SP *)((long)&(local_d8->integrator).
                                 super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 4);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar7 == 0) {
            this_01 = (ParamSet *)(*in_RDX + 8);
            result = &local_d8->pixelFilter;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar7 != 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_50,"unknown \'distant\' light source param \'",&local_c0);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_a0 = (long *)*plVar8;
              plVar9 = plVar8 + 2;
              if (local_a0 == plVar9) {
                local_90 = *plVar9;
                lStack_88 = plVar8[3];
                local_a0 = &local_90;
              }
              else {
                local_90 = *plVar9;
              }
              local_98 = plVar8[1];
              *plVar8 = (long)plVar9;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::runtime_error::runtime_error(this_00,(string *)&local_a0);
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            this_01 = (ParamSet *)(*in_RDX + 8);
            result = (SP *)((long)&(local_d8->pixelFilter).
                                   super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 4);
          }
        }
      }
      syntactic::ParamSet::getParam3f(this_01,(float *)result,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_80.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
        operator_delete(local_80.first._M_dataplus._M_p,
                        local_80.first.field_2._M_allocated_capacity + 1);
      }
      auVar13 = std::_Rb_tree_increment(p_Var12);
      _Var10._M_pi = auVar13._8_8_;
      p_Var12 = auVar13._0_8_;
    } while (p_Var12 != p_Var11);
  }
  (local_c8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_c8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  (local_c8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_d0._M_pi;
  SVar14.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  SVar14.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8;
  return (SP)SVar14.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LightSource::SP SemanticParser::createLightSource_distant
  (pbrt::syntactic::LightSource::SP in)
  {
    DistantLightSource::SP light = std::make_shared<DistantLightSource>();
    light->transform = in->transform.atStart;
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "from") {
        in->getParam3f(&light->from.x,name);
        continue;
      }
      if (name == "to") {
        in->getParam3f(&light->to.x,name);
        continue;
      }
      if (name == "L") {
        in->getParam3f(&light->L.x,name);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      throw std::runtime_error("unknown 'distant' light source param '"+name+"'");
    }
    return light;
  }